

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O0

void __thiscall
KDIS::UTILS::DeadReckoningCalculator::calcDeadReckoningFVB
          (DeadReckoningCalculator *this,WorldCoordinates *PositionOut,KFLOAT32 totalTimeSinceReset)

{
  Matrix<float,(unsigned_char)3,(unsigned_char)3> *this_00;
  float fVar1;
  double __x;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  float fVar8;
  float fVar9;
  Vector local_198;
  Vector local_180;
  WorldCoordinates local_168;
  Vector local_138;
  Vector local_120;
  WorldCoordinates local_108;
  Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> local_e4;
  Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> local_c0;
  Matrix<float,(unsigned_char)3,(unsigned_char)3> local_9c [8];
  TMATRIX IR2Matrix;
  TMATRIX R2Matrix;
  KFLOAT64 f64R2SkewScale;
  KFLOAT64 f64R2IScalar;
  KFLOAT64 f64R2Scale;
  KFLOAT32 m_f32DeltaPow2;
  KFLOAT32 m_f32MagPow4;
  KFLOAT32 m_f32MagPow3;
  KFLOAT32 m_f32MagPow2;
  KFLOAT64 f64DeltaMag;
  KFLOAT32 totalTimeSinceReset_local;
  WorldCoordinates *PositionOut_local;
  DeadReckoningCalculator *this_local;
  
  calcDeadReckoningFPB(this,PositionOut,totalTimeSinceReset);
  __x = (double)((float)totalTimeSinceReset * (float)this->m_f64Magnitude);
  if (__x <= 1e-05) {
    Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator*
              (&local_198,&this->m_initOrientationMatrixTranspose,&this->m_Ab);
    DATA_TYPE::Vector::operator*(&local_180,&local_198,totalTimeSinceReset);
    DATA_TYPE::WorldCoordinates::operator+(&local_168,PositionOut,&local_180);
    DATA_TYPE::WorldCoordinates::operator=(PositionOut,&local_168);
    DATA_TYPE::WorldCoordinates::~WorldCoordinates(&local_168);
    DATA_TYPE::Vector::~Vector(&local_180);
    DATA_TYPE::Vector::~Vector(&local_198);
  }
  else {
    fVar8 = (float)this->m_f64Magnitude * (float)this->m_f64Magnitude;
    fVar9 = fVar8 * (float)this->m_f64Magnitude;
    fVar1 = (float)this->m_f64Magnitude;
    dVar2 = cos(__x);
    dVar3 = sin(__x);
    dVar4 = cos(__x);
    dVar5 = sin(__x);
    dVar6 = sin(__x);
    dVar7 = cos(__x);
    IR2Matrix.Data[2]._4_8_ = *(undefined8 *)(this->m_wwMatrix).Data[0];
    Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::Matrix
              ((Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *)local_9c);
    this_00 = (Matrix<float,(unsigned_char)3,(unsigned_char)3> *)(IR2Matrix.Data[2] + 1);
    Matrix<float,(unsigned_char)3,(unsigned_char)3>::operator*=
              (this_00,((((double)(float)(__x * __x) * 0.5 - dVar2) - __x * dVar3) + 1.0) /
                       (double)(fVar9 * fVar1));
    Matrix<float,(unsigned_char)3,(unsigned_char)3>::operator*=
              (local_9c,((__x * dVar5 + dVar4) - 1.0) / (double)fVar8);
    Matrix<float,(unsigned_char)3,(unsigned_char)3>::operator*
              (&local_e4,(Matrix<float,(unsigned_char)3,(unsigned_char)3> *)&this->m_SkewOmegaMatrix
               ,(dVar6 - __x * dVar7) / (double)fVar9);
    Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator+
              (&local_c0,(Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *)local_9c,
               &local_e4);
    Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator+=
              ((Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *)this_00,&local_c0);
    Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator*
              (&local_138,(Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *)this_00,
               &this->m_Ab);
    Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator*
              (&local_120,&this->m_initOrientationMatrixTranspose,&local_138);
    DATA_TYPE::WorldCoordinates::operator+(&local_108,PositionOut,&local_120);
    DATA_TYPE::WorldCoordinates::operator=(PositionOut,&local_108);
    DATA_TYPE::WorldCoordinates::~WorldCoordinates(&local_108);
    DATA_TYPE::Vector::~Vector(&local_120);
    DATA_TYPE::Vector::~Vector(&local_138);
  }
  return;
}

Assistant:

void DeadReckoningCalculator::calcDeadReckoningFVB( WorldCoordinates & PositionOut, const KFLOAT32 totalTimeSinceReset )
{
    // the first part of the equation
    calcDeadReckoningFPB( PositionOut, totalTimeSinceReset);

    // now adding to the position R0t_w->b * R2 * Ab
    // Calculate Magnitude, scalars etc
    const KFLOAT64 f64DeltaMag = totalTimeSinceReset * m_f64Magnitude;

    if( f64DeltaMag > MAGIC_EPSILON )
    {

        KFLOAT32 m_f32MagPow2 = m_f64Magnitude * m_f64Magnitude;
        KFLOAT32 m_f32MagPow3 = m_f32MagPow2 * m_f64Magnitude;
        KFLOAT32 m_f32MagPow4 = m_f32MagPow3 * m_f64Magnitude;
        KFLOAT32 m_f32DeltaPow2 = f64DeltaMag * f64DeltaMag;

        KFLOAT64 f64R2Scale = (0.5 * m_f32DeltaPow2 - cos( f64DeltaMag )- f64DeltaMag * sin( f64DeltaMag ) + 1)/m_f32MagPow4;

        KFLOAT64 f64R2IScalar = ( cos( f64DeltaMag ) + f64DeltaMag * sin( f64DeltaMag ) - 1.0 ) / m_f32MagPow2;

        KFLOAT64 f64R2SkewScale = ( sin( f64DeltaMag ) - f64DeltaMag * cos( f64DeltaMag ) ) / m_f32MagPow3;

        // Create the ww matrix
        TMATRIX R2Matrix( m_wwMatrix ), IR2Matrix;
        R2Matrix *= f64R2Scale;
        IR2Matrix *= f64R2IScalar;
        R2Matrix += ( IR2Matrix + ( m_SkewOmegaMatrix * f64R2SkewScale ) );

        PositionOut = PositionOut + ( m_initOrientationMatrixTranspose * ( R2Matrix * m_Ab ) );
    } else
        PositionOut = PositionOut + ( m_initOrientationMatrixTranspose * m_Ab ) * totalTimeSinceReset;
}